

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_static_analyzer.cpp
# Opt level: O1

void __thiscall
Analyzer::updateNearestAssignmentsAfterCheck(Analyzer *this,Node *parent,Node *n,int i)

{
  TokenType TVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  char *__haystack;
  char *pcVar5;
  pointer ppNVar6;
  long lVar7;
  
  updateNearestAssignments(this,n);
  if ((((n->nodeType == PNT_BINARY_OP) && (uVar4 = (ulong)n->tok->type, uVar4 < 0x2b)) &&
      ((0x7a000000040U >> (uVar4 & 0x3f) & 1) != 0)) &&
     (((bVar2 = isVarCanBeNull(this,*(n->children).
                                     super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                                     super__Vector_impl_data._M_start), !bVar2 &&
       (bVar2 = isVarCanBeString(this,*(n->children).
                                       super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                                       super__Vector_impl_data._M_start), !bVar2)) ||
      ((TVar1 = n->tok->type, TVar1 == TK_NEWSLOT || (TVar1 == TK_ASSIGN)))))) {
    removeNearestAssignmentsFoundAt
              (this,*(n->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                     super__Vector_impl_data._M_start);
  }
  if (parent->nodeType == PNT_IF_ELSE) {
    removeNearestAssignmentsExcludeString
              (this,(parent->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                    super__Vector_impl_data._M_start[i]);
  }
  if ((n->nodeType - PNT_WHILE_LOOP < 2) &&
     (ppNVar6 = (n->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                super__Vector_impl_data._M_start,
     1 < (int)((ulong)((long)(n->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                             _M_impl.super__Vector_impl_data._M_finish - (long)ppNVar6) >> 3))) {
    lVar7 = 1;
    do {
      removeNearestAssignmentsFoundAt(this,ppNVar6[lVar7]);
      lVar7 = lVar7 + 1;
      ppNVar6 = (n->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while (lVar7 < (int)((ulong)((long)(n->children).
                                         super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl
                                         .super__Vector_impl_data._M_finish - (long)ppNVar6) >> 3));
  }
  if (n->nodeType - PNT_FUNCTION_CALL < 2) {
    __haystack = getFunctionName(this,n);
    bVar2 = isTestPresentInNodePath(this,n);
    if ((((bVar2) || (pcVar5 = strstr(__haystack,"assert"), pcVar5 != (char *)0x0)) ||
        (iVar3 = strcmp(__haystack,"type"), iVar3 == 0)) &&
       (ppNVar6 = (n->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                  super__Vector_impl_data._M_start,
       1 < (int)((ulong)((long)(n->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                               _M_impl.super__Vector_impl_data._M_finish - (long)ppNVar6) >> 3))) {
      lVar7 = 1;
      do {
        removeNearestAssignmentsFoundAt(this,ppNVar6[lVar7]);
        lVar7 = lVar7 + 1;
        ppNVar6 = (n->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
      } while (lVar7 < (int)((ulong)((long)(n->children).
                                           super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                                           _M_impl.super__Vector_impl_data._M_finish - (long)ppNVar6
                                    ) >> 3));
    }
  }
  if (((parent->nodeType == PNT_STATEMENT_LIST) && ((ulong)n->nodeType < 0x33)) &&
     (((0x4d1f800000000U >> ((ulong)n->nodeType & 0x3f) & 1) != 0 &&
      (nearest_assignments.
       super__Vector_base<std::pair<Node_*,_std::pair<Node_*,_bool>_>,_std::allocator<std::pair<Node_*,_std::pair<Node_*,_bool>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish !=
       nearest_assignments.
       super__Vector_base<std::pair<Node_*,_std::pair<Node_*,_bool>_>,_std::allocator<std::pair<Node_*,_std::pair<Node_*,_bool>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start)))) {
    nearest_assignments.
    super__Vector_base<std::pair<Node_*,_std::pair<Node_*,_bool>_>,_std::allocator<std::pair<Node_*,_std::pair<Node_*,_bool>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         nearest_assignments.
         super__Vector_base<std::pair<Node_*,_std::pair<Node_*,_bool>_>,_std::allocator<std::pair<Node_*,_std::pair<Node_*,_bool>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
  }
  return;
}

Assistant:

void updateNearestAssignmentsAfterCheck(Node * parent, Node * n, int i)
  {
    Node * node = parent;
    updateNearestAssignments(n);

    if (n->nodeType == PNT_BINARY_OP && (n->tok.type == TK_ASSIGN || n->tok.type == TK_PLUSEQ || n->tok.type == TK_MULEQ ||
      n->tok.type == TK_MINUSEQ || n->tok.type == TK_DIVEQ || n->tok.type == TK_NEWSLOT))
    {
      if ((!isVarCanBeNull(n->children[0]) && !isVarCanBeString(n->children[0])) ||
        n->tok.type == TK_ASSIGN || n->tok.type == TK_NEWSLOT)
      {
        removeNearestAssignmentsFoundAt(n->children[0]);
      }
    }

    if (node->nodeType == PNT_IF_ELSE)
      removeNearestAssignmentsExcludeString(node->children[i]);


    if (n->nodeType == PNT_WHILE_LOOP || n->nodeType == PNT_DO_WHILE_LOOP)
    {
      for (int j = 1; j < int(n->children.size()); j++)
        removeNearestAssignmentsFoundAt(n->children[j]);
    }

    if (n->nodeType == PNT_FUNCTION_CALL || n->nodeType == PNT_FUNCTION_CALL_IF_NOT_NULL)
    {
      const char * functionName = getFunctionName(n);
      if (isTestPresentInNodePath(n) || strstr(functionName, "assert") || strcmp(functionName, "type") == 0)
        for (int j = 1; j < int(n->children.size()); j++)
          removeNearestAssignmentsFoundAt(n->children[j]);
    }


    if (node->nodeType == PNT_STATEMENT_LIST)
      if (n->nodeType == PNT_LOCAL_FUNCTION || n->nodeType == PNT_FUNCTION ||
        n->nodeType == PNT_CONTINUE || n->nodeType == PNT_BREAK || n->nodeType == PNT_RETURN ||
        n->nodeType == PNT_WHILE_LOOP || n->nodeType == PNT_DO_WHILE_LOOP ||
        n->nodeType == PNT_SWITCH_STATEMENT || n->nodeType == PNT_FOR_LOOP ||
        n->nodeType == PNT_FOR_EACH_LOOP)
      {
        nearest_assignments.clear();
      }
  }